

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

void Gia_ManInvertPos(Gia_Man_t *pAig)

{
  int iVar1;
  bool bVar2;
  undefined4 local_1c;
  Gia_Obj_t *pGStack_18;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pAig_local;
  
  local_1c = 0;
  while( true ) {
    iVar1 = Gia_ManPoNum(pAig);
    bVar2 = false;
    if (local_1c < iVar1) {
      pGStack_18 = Gia_ManCo(pAig,local_1c);
      bVar2 = pGStack_18 != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    Gia_ObjFlipFaninC0(pGStack_18);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void Gia_ManInvertPos( Gia_Man_t * pAig )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachPo( pAig, pObj, i )
        Gia_ObjFlipFaninC0( pObj );
}